

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::add_escaped_characters(string *str)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  size_type sloc;
  char s;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *out;
  undefined7 in_stack_ffffffffffffff98;
  char in_stack_ffffffffffffff9f;
  string *this_00;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  undefined1 local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = 0;
  this_00 = in_RDI;
  local_10 = in_RSI;
  ::std::__cxx11::string::string(in_stack_ffffffffffffffb0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(local_10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_stack_ffffffffffffffc0,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
            );
  local_30 = local_10;
  local_38._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_38);
    this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           find_first_of(in_RDI,in_stack_ffffffffffffff9f,0x1a1a39);
    __c = (char)((ulong)this_00 >> 0x38);
    if (this == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 0xffffffffffffffff,__c);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this,__c);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                (in_RDI,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this,(char)((ulong)this_00 >> 0x38));
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  return in_RDI;
}

Assistant:

CLI11_INLINE std::string add_escaped_characters(const std::string &str) {
    std::string out;
    out.reserve(str.size() + 4);
    for(char s : str) {
        auto sloc = escapedChars.find_first_of(s);
        if(sloc != std::string::npos) {
            out.push_back('\\');
            out.push_back(escapedCharsCode[sloc]);
        } else {
            out.push_back(s);
        }
    }
    return out;
}